

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O1

void __thiscall FPalette::SetPalette(FPalette *this,BYTE *colors)

{
  bool bVar1;
  undefined4 uVar2;
  int i;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  BYTE BVar6;
  uint uVar7;
  undefined4 uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  
  lVar3 = 0;
  do {
    uVar5 = (ulong)colors[2];
    this->BaseColors[lVar3].field_0 =
         (anon_union_4_2_12391d7c_for_PalEntry_0)
         ((uint)colors[1] << 8 | (uint)*colors << 0x10 | (uint)colors[2]);
    this->Remap[lVar3] = (BYTE)lVar3;
    lVar3 = lVar3 + 1;
    colors = colors + 3;
  } while (lVar3 != 0x100);
  uVar7 = 0x30603;
  uVar4 = 0;
  uVar9 = 0;
  do {
    uVar11 = this->BaseColors[uVar4].field_0.field_0.r ^ 0xff;
    uVar13 = this->BaseColors[uVar4].field_0.field_0.g ^ 0xff;
    uVar12 = this->BaseColors[uVar4].field_0.field_0.b ^ 0xff;
    uVar11 = uVar12 * uVar12 + uVar13 * uVar13 + uVar11 * uVar11;
    bVar1 = true;
    if (uVar11 < uVar7) {
      if (uVar11 == 0) {
        bVar1 = false;
        uVar5 = uVar4 & 0xffffffff;
      }
      else {
        uVar9 = uVar4 & 0xffffffff;
        uVar7 = uVar11;
      }
    }
    uVar10 = uVar5;
  } while ((bVar1) && (uVar4 = uVar4 + 1, uVar10 = uVar9, (int)uVar4 != 0xff));
  this->WhiteIndex = (BYTE)uVar10;
  uVar7 = 0x30603;
  uVar5 = 0;
  uVar8 = 0;
  while( true ) {
    uVar11 = (uint)this->BaseColors[uVar5].field_0.field_0.r;
    uVar13 = (uint)this->BaseColors[uVar5].field_0.field_0.g;
    uVar12 = (uint)this->BaseColors[uVar5].field_0.field_0.b;
    uVar12 = uVar12 * uVar12 + uVar13 * uVar13 + uVar11 * uVar11;
    bVar1 = true;
    uVar2 = uVar8;
    uVar11 = uVar7;
    if ((uVar12 < uVar7) && (uVar2 = (int)uVar5, uVar11 = uVar12, uVar12 == 0)) {
      bVar1 = false;
      uVar10 = uVar5 & 0xffffffff;
      uVar2 = uVar8;
      uVar11 = uVar7;
    }
    uVar7 = uVar11;
    uVar8 = uVar2;
    BVar6 = (BYTE)uVar8;
    if (!bVar1) break;
    uVar5 = uVar5 + 1;
    if ((int)uVar5 == 0xff) {
LAB_005815ad:
      this->BlackIndex = BVar6;
      return;
    }
  }
  BVar6 = (BYTE)uVar10;
  goto LAB_005815ad;
}

Assistant:

void FPalette::SetPalette (const BYTE *colors)
{
	for (int i = 0; i < 256; i++, colors += 3)
	{
		BaseColors[i] = PalEntry (colors[0], colors[1], colors[2]);
		Remap[i] = i;
	}

	// Find white and black from the original palette so that they can be
	// used to make an educated guess of the translucency % for a BOOM
	// translucency map.
	WhiteIndex = BestColor ((DWORD *)BaseColors, 255, 255, 255, 0, 255);
	BlackIndex = BestColor ((DWORD *)BaseColors, 0, 0, 0, 0, 255);
}